

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

string * __thiscall
cmCPackIFWGenerator::GetGroupPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,cmCPackComponentGroup *group)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmCPackComponentGroup *pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  char *__s;
  size_t sVar9;
  _Base_ptr p_Var10;
  long *plVar11;
  size_type *psVar12;
  long lVar13;
  bool bVar14;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  _Alloc_hider local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined1 uStack_58;
  undefined4 uStack_57;
  undefined2 uStack_53;
  char cStack_51;
  string local_50;
  
  local_68 = 0;
  local_60 = '\0';
  if (group == (cmCPackComponentGroup *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 1) = CONCAT17(uStack_58,uStack_5f);
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 9) = uStack_57;
    *(undefined2 *)((long)&__return_storage_ptr__->field_2 + 0xd) = uStack_53;
    (__return_storage_ptr__->field_2)._M_local_buf[0xf] = cStack_51;
    __return_storage_ptr__->_M_string_length = 0;
    return __return_storage_ptr__;
  }
  p_Var10 = (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->GroupPackages)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = &p_Var1->_M_header;
  local_70._M_p = &local_60;
  if (p_Var10 != (_Base_ptr)0x0) {
    do {
      if (*(cmCPackComponentGroup **)(p_Var10 + 1) >= group) {
        p_Var7 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(cmCPackComponentGroup **)(p_Var10 + 1) < group];
    } while (p_Var10 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var7 != p_Var1) && (*(cmCPackComponentGroup **)(p_Var7 + 1) <= group)
        ) && (p_Var10 = p_Var7[1]._M_parent, p_Var10 != (_Base_ptr)0x0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,p_Var10[5]._M_parent,
                 (long)&(p_Var10[5]._M_parent)->_M_color + (long)&(p_Var10[5]._M_left)->_M_color);
      if (local_70._M_p == &local_60) {
        return __return_storage_ptr__;
      }
      operator_delete(local_70._M_p,CONCAT71(uStack_5f,local_60) + 1);
      return __return_storage_ptr__;
    }
  }
  cmsys::SystemTools::UpperCase(&local_50,&group->Name);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x536a5a);
  local_b0 = &local_a0;
  plVar11 = plVar8 + 2;
  if ((long *)*plVar8 == plVar11) {
    local_a0 = *plVar11;
    lStack_98 = plVar8[3];
  }
  else {
    local_a0 = *plVar11;
    local_b0 = (long *)*plVar8;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)plVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  paVar2 = &local_90.field_2;
  psVar12 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90.field_2._8_8_ = plVar8[3];
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar12;
    local_90._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_90._M_string_length = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __s = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (__s == (char *)0x0) {
    pcVar3 = (group->Name)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar3,pcVar3 + (group->Name)._M_string_length);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)paVar2;
    sVar9 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar9);
  }
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = group->ParentGroup;
  if (pcVar4 == (cmCPackComponentGroup *)0x0) goto LAB_0016b22b;
  p_Var10 = (this->GroupPackages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  if (p_Var10 == (_Base_ptr)0x0) {
LAB_0016b0d6:
    lVar13 = 0;
  }
  else {
    do {
      if (*(cmCPackComponentGroup **)(p_Var10 + 1) >= pcVar4) {
        p_Var7 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(cmCPackComponentGroup **)(p_Var10 + 1) < pcVar4];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var7 == p_Var1) ||
       (pcVar4 < (cmCPackComponentGroup *)((_Rb_tree_header *)p_Var7)->_M_node_count))
    goto LAB_0016b0d6;
    lVar13 = *(long *)((long)p_Var7 + 0x28);
  }
  if (this->ResolveDuplicateNames == false) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
    _Var5._M_p = local_90._M_dataplus._M_p;
    if (local_90._M_string_length == *(size_t *)(lVar13 + 0xb0)) {
      if (local_90._M_string_length == 0) {
        bVar14 = true;
      }
      else {
        iVar6 = bcmp(local_90._M_dataplus._M_p,*(void **)(lVar13 + 0xa8),local_90._M_string_length);
        bVar14 = iVar6 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar2) {
      operator_delete(_Var5._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (!bVar14) {
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,*(long *)(lVar13 + 0xa8),
                 *(long *)(lVar13 + 0xa8) + *(long *)(lVar13 + 0xb0));
      std::__cxx11::string::append((char *)&local_b0);
      plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_p);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90.field_2._8_8_ = plVar8[3];
        local_90._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar12;
        local_90._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_90._M_string_length = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
    }
  }
LAB_0016b22b:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_70._M_p == &local_60) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) =
         CONCAT17(cStack_51,CONCAT25(uStack_53,CONCAT41(uStack_57,uStack_58)));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_70._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  __return_storage_ptr__->_M_string_length = local_68;
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetGroupPackageName(
  cmCPackComponentGroup* group) const
{
  std::string name;
  if (!group) {
    return name;
  }
  if (cmCPackIFWPackage* package = this->GetGroupPackage(group)) {
    return package->Name;
  }
  const char* option =
    this->GetOption("CPACK_IFW_COMPONENT_GROUP_" +
                    cmsys::SystemTools::UpperCase(group->Name) + "_NAME");
  name = option ? option : group->Name;
  if (group->ParentGroup) {
    cmCPackIFWPackage* package = this->GetGroupPackage(group->ParentGroup);
    bool dot = !this->ResolveDuplicateNames;
    if (dot && name.substr(0, package->Name.size()) == package->Name) {
      dot = false;
    }
    if (dot) {
      name = package->Name + "." + name;
    }
  }
  return name;
}